

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O0

S2CellId __thiscall S2CellId::FromDebugString(S2CellId *this,string_view str)

{
  int position;
  size_type sVar1;
  const_reference pcVar2;
  S2CellId SVar3;
  int local_34;
  int child_pos;
  int i;
  S2CellId id;
  int face;
  int level;
  string_view str_local;
  
  str_local.ptr_ = str.ptr_;
  _face = this;
  sVar1 = absl::string_view::size((string_view *)&face);
  id.id_._4_4_ = (int)sVar1 + -2;
  if ((id.id_._4_4_ < 0) || (0x1e < id.id_._4_4_)) {
    str_local.length_ = (size_type)None();
  }
  else {
    pcVar2 = absl::string_view::operator[]((string_view *)&face,0);
    id.id_._0_4_ = *pcVar2 + -0x30;
    if (((-1 < (int)id.id_) && ((int)id.id_ < 6)) &&
       (pcVar2 = absl::string_view::operator[]((string_view *)&face,1), *pcVar2 == '/')) {
      _child_pos = FromFace((int)id.id_);
      local_34 = 2;
      while( true ) {
        sVar1 = absl::string_view::size((string_view *)&face);
        if (sVar1 <= (ulong)(long)local_34) {
          return (S2CellId)_child_pos;
        }
        pcVar2 = absl::string_view::operator[]((string_view *)&face,(long)local_34);
        position = *pcVar2 + -0x30;
        if ((position < 0) || (3 < position)) break;
        _child_pos = child((S2CellId *)&child_pos,position);
        local_34 = local_34 + 1;
      }
      SVar3 = None();
      return (S2CellId)SVar3.id_;
    }
    str_local.length_ = (size_type)None();
  }
  return (S2CellId)str_local.length_;
}

Assistant:

S2CellId S2CellId::FromDebugString(absl::string_view str) {
  // This function is reasonably efficient, but is only intended for use in
  // tests.
  int level = static_cast<int>(str.size() - 2);
  if (level < 0 || level > S2CellId::kMaxLevel) return S2CellId::None();
  int face = str[0] - '0';
  if (face < 0 || face > 5 || str[1] != '/') return S2CellId::None();
  S2CellId id = S2CellId::FromFace(face);
  for (int i = 2; i < str.size(); ++i) {
    int child_pos = str[i] - '0';
    if (child_pos < 0 || child_pos > 3) return S2CellId::None();
    id = id.child(child_pos);
  }
  return id;
}